

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

fy_anchor * fy_document_lookup_anchor_by_token(fy_document *fyd,fy_token *anchor)

{
  fy_token *fyt;
  int iVar1;
  fy_anchor *pfVar2;
  char *pcVar3;
  fy_input *pfVar4;
  fy_mark *pfVar5;
  int iVar6;
  fy_anchor *pfVar7;
  size_t sVar8;
  size_t sVar9;
  fy_anchor_list *pfVar10;
  fy_anchor *pfVar11;
  size_t text_len;
  size_t anchor_len;
  size_t local_50;
  char *local_48;
  size_t local_40;
  fy_anchor *local_38;
  
  if (anchor != (fy_token *)0x0 && fyd != (fy_document *)0x0) {
    if ((fyd->axl != (fy_accel *)0x0) && (fyd->naxl != (fy_accel *)0x0)) {
      pfVar2 = (fy_anchor *)fy_accel_lookup(fyd->axl,anchor);
      if (pfVar2 == (fy_anchor *)0x0) {
        return (fy_anchor *)0x0;
      }
      if ((pfVar2->field_0x20 & 1) == 0) {
        return pfVar2;
      }
    }
    local_48 = fy_token_get_text(anchor,&local_40);
    if (local_48 != (char *)0x0) {
      pfVar2 = (fy_anchor *)(fyd->anchors)._lh.next;
      pfVar10 = &fyd->anchors;
      if (pfVar2 != (fy_anchor *)0x0 && pfVar2 != (fy_anchor *)pfVar10) {
        iVar6 = 0;
        pfVar11 = (fy_anchor *)0x0;
        do {
          pcVar3 = fy_token_get_text(pfVar2->anchor,&local_50);
          if (pcVar3 == (char *)0x0) {
            return (fy_anchor *)0x0;
          }
          if (local_40 == local_50) {
            iVar1 = bcmp(local_48,pcVar3,local_40);
            if (iVar1 == 0) {
              pfVar11 = pfVar2;
            }
            iVar6 = iVar6 + (uint)(iVar1 == 0);
          }
          pfVar2 = (fy_anchor *)(pfVar2->node).next;
        } while ((pfVar2 != (fy_anchor *)pfVar10) && (pfVar2 != (fy_anchor *)0x0));
        if (iVar6 != 0) {
          if (iVar6 == 1) {
            return pfVar11;
          }
          pfVar2 = (fy_anchor *)(pfVar10->_lh).next;
          if (pfVar2 == (fy_anchor *)0x0 || pfVar2 == (fy_anchor *)pfVar10) {
            pfVar7 = (fy_anchor *)0x0;
          }
          else {
            pfVar7 = (fy_anchor *)0x0;
            do {
              fyt = pfVar2->anchor;
              if (fyt == (fy_token *)0x0) {
                pfVar4 = (fy_input *)0x0;
              }
              else {
                pfVar4 = (fyt->handle).fyi;
              }
              if (pfVar4 == (anchor->handle).fyi) {
                pcVar3 = fy_token_get_text(fyt,&local_50);
                if (pcVar3 == (char *)0x0) {
                  return (fy_anchor *)0x0;
                }
                if ((local_40 == local_50) && (iVar6 = bcmp(local_48,pcVar3,local_40), iVar6 == 0))
                {
                  sVar8 = 0xffffffffffffffff;
                  sVar9 = 0xffffffffffffffff;
                  local_38 = pfVar7;
                  if (pfVar2->anchor != (fy_token *)0x0) {
                    pfVar5 = fy_token_start_mark(pfVar2->anchor);
                    sVar9 = 0xffffffffffffffff;
                    if (pfVar5 != (fy_mark *)0x0) {
                      sVar9 = pfVar5->input_pos;
                    }
                  }
                  pfVar5 = fy_token_start_mark(anchor);
                  if (pfVar5 != (fy_mark *)0x0) {
                    sVar8 = pfVar5->input_pos;
                  }
                  pfVar7 = local_38;
                  if (sVar9 < sVar8) {
                    pfVar7 = pfVar2;
                  }
                }
              }
              pfVar2 = (fy_anchor *)(pfVar2->node).next;
            } while ((pfVar2 != (fy_anchor *)pfVar10) && (pfVar2 != (fy_anchor *)0x0));
          }
          if (pfVar7 != (fy_anchor *)0x0) {
            return pfVar7;
          }
          return pfVar11;
        }
      }
    }
  }
  return (fy_anchor *)0x0;
}

Assistant:

struct fy_anchor *
fy_document_lookup_anchor_by_token(struct fy_document *fyd,
                                   struct fy_token *anchor) {
    struct fy_anchor *fya, *fya_found, *fya_found2;
    struct fy_anchor_list *fyal;
    const char *anchor_text, *text;
    size_t anchor_len, text_len;
    int count;

    if (!fyd || !anchor)
        return NULL;

    /* first try direct match (it's faster and the common case) */
    if (fy_document_is_accelerated(fyd)) {
        fya = fy_document_accel_lookup_anchor_by_token(fyd, anchor);
        if (!fya)
            return NULL;

        /* single anchor? return it */
        if (!fya->multiple)
            return fya;

        /* multiple anchors, fall-through */
    }

    anchor_text = fy_token_get_text(anchor, &anchor_len);
    if (!anchor_text)
        return NULL;

    fyal = &fyd->anchors;

    /* first pass, try with a single match */
    count = 0;
    fya_found = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {
        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len)) {
            count++;
            fya_found = fya;
        }
    }

    /* not found */
    if (!count)
        return NULL;

    /* single one? fine */
    if (count == 1)
        return fya_found;

    /* multiple ones, must pick the one that's the last one before
	 * the requesting token */
    /* fyd_notice(fyd, "multiple anchors for %.*s", (int)anchor_len, anchor_text); */

    /* only try the ones on the same input
	 * we don't try to cover the case where the label is referenced
	 * by other constructed documents
	 */
    fya_found2 = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {

        /* only on the same input */
        if (fy_token_get_input(fya->anchor) != fy_token_get_input(anchor))
            continue;

        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len) &&
            fy_token_start_pos(fya->anchor) < fy_token_start_pos(anchor)) {
            fya_found2 = fya;
        }
    }

    /* just return the one find earlier */
    if (!fya_found2)
        return fya_found;

    /* return the one that was the latest */
    return fya_found2;
}